

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall Rml::DataViewStyle::Update(DataViewStyle *this,DataModel *model)

{
  char cVar1;
  bool bVar2;
  String *name;
  Element *element_00;
  DataExpression *this_00;
  bool local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Property *local_c8;
  Property *p;
  undefined1 local_a0 [8];
  String value;
  DataExpressionInterface expr_interface;
  Element *element;
  Variant variant;
  bool result;
  String *property_name;
  DataModel *model_local;
  DataViewStyle *this_local;
  
  name = DataViewCommon::GetModifier_abi_cxx11_(&this->super_DataViewCommon);
  variant.data[0x1f] = '\0';
  Variant::Variant((Variant *)&element);
  element_00 = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)((long)&value.field_2 + 8),model,element_00,(Event *)0x0);
  if (element_00 != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar2 = DataExpression::Run(this_00,(DataExpressionInterface *)((long)&value.field_2 + 8),
                                (Variant *)&element);
    if (bVar2) {
      ::std::__cxx11::string::string((string *)&p);
      Variant::Get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (Variant *)&element,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
      ::std::__cxx11::string::~string((string *)&p);
      local_c8 = Element::GetLocalProperty(element_00,name);
      local_121 = true;
      if (local_c8 != (Property *)0x0) {
        Property::Get<std::__cxx11::string>(&local_e8,local_c8);
        local_121 = ::std::operator!=(&local_e8,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a0);
        ::std::__cxx11::string::~string((string *)&local_e8);
      }
      if (local_121 != false) {
        Element::SetProperty(element_00,name,(String *)local_a0);
        variant.data[0x1f] = '\x01';
      }
      ::std::__cxx11::string::~string((string *)local_a0);
    }
  }
  cVar1 = variant.data[0x1f];
  Variant::~Variant((Variant *)&element);
  return (bool)(cVar1 & 1);
}

Assistant:

bool DataViewStyle::Update(DataModel& model)
{
	const String& property_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const String value = variant.Get<String>();
		const Property* p = element->GetLocalProperty(property_name);
		if (!p || p->Get<String>() != value)
		{
			element->SetProperty(property_name, value);
			result = true;
		}
	}
	return result;
}